

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O1

JsErrorCode JsTTDDiagWriteLog(char *uri,size_t uriLength)

{
  ScriptContext *scriptContext;
  EventLog *this;
  JsrtRuntime *this_00;
  DebugManager *pDVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  JsrtContext *pJVar5;
  JsrtDebugManager *pJVar6;
  undefined4 *puVar7;
  void *unaff_retaddr;
  undefined1 auStack_d8 [8];
  TTDebuggerAbortException anon_var_0;
  TTDebuggerSourceLocation local_98;
  undefined1 local_58 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar5 = JsrtContext::GetCurrent();
  JVar4 = CheckContext(pJVar5,true,false);
  if (JVar4 == JsNoError) {
    scriptContext =
         (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
               ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_d8 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_58,scriptContext,(ScriptEntryExitRecord *)auStack_d8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(scriptContext,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_58);
    this = scriptContext->threadContext->TTDLog;
    JVar4 = JsErrorDiagUnableToPerformAction;
    if (this != (EventLog *)0x0) {
      bVar3 = TTD::EventLog::CanWriteInnerLoopTrace(this);
      if (bVar3) {
        pJVar5 = JsrtContext::GetCurrent();
        this_00 = (pJVar5->runtime).ptr;
        pDVar1 = this_00->threadContext->debugManager;
        JVar4 = JsErrorDiagNotAtBreak;
        if ((pDVar1 != (DebugManager *)0x0) && (pDVar1->isAtDispatchHalt == true)) {
          pJVar6 = JsrtRuntime::GetJsrtDebugManager(this_00);
          TTD::TTDebuggerSourceLocation::TTDebuggerSourceLocation(&local_98);
          TTD::ExecutionInfoManager::GetTimeAndPositionForDebugger
                    (pJVar6->threadContext->TTDExecutionInfo,&local_98);
          TTD::EventLog::InnerLoopEmitLog(pJVar6->threadContext->TTDLog,&local_98,uri,uriLength);
          TTD::TTDebuggerSourceLocation::~TTDebuggerSourceLocation(&local_98);
          JVar4 = JsNoError;
        }
      }
    }
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_58);
    if ((JVar4 - JsErrorNoCurrentContext < 2) || (JVar4 == JsErrorFatal)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                         ,0xcc,
                         "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                         ,
                         "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsTTDDiagWriteLog(_In_reads_(uriLength) const char* uri, _In_ size_t uriLength)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<true>([&](Js::ScriptContext * scriptContext) -> JsErrorCode {
        if (!scriptContext->GetThreadContext()->IsRuntimeInTTDMode() || !scriptContext->GetThreadContext()->TTDLog->CanWriteInnerLoopTrace())
        {
            return JsErrorDiagUnableToPerformAction;
        }

        JsrtContext *currentContext = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = currentContext->GetRuntime();

        VALIDATE_RUNTIME_IS_AT_BREAK(runtime);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        TTD::TTDebuggerSourceLocation cloc;
        jsrtDebugManager->GetThreadContext()->TTDExecutionInfo->GetTimeAndPositionForDebugger(cloc);
        jsrtDebugManager->GetThreadContext()->TTDLog->InnerLoopEmitLog(cloc, uri, uriLength);

        return JsNoError;
    });
#endif
}